

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

bool __thiscall
ImplicitDepLoader::LoadDepFile(ImplicitDepLoader *this,Edge *edge,string *path,string *err)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  Metrics *this_00;
  FILE *__stream;
  bool bVar3;
  int iVar4;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var5;
  iterator iVar6;
  Node *pNVar7;
  Metric *pMVar8;
  ImplicitDepLoader *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  StringPiece *this_03;
  pointer pSVar9;
  uint64_t slash_bits;
  DepfileParser depfile;
  string depfile_err;
  string content;
  ScopedMetric metrics_h_scoped;
  uint64_t unused;
  StringPiece opath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  DepfileParser local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  ScopedMetric local_98;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  uint64_t local_48;
  State *local_40;
  DiskInterface *local_38;
  
  if ((LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar8 = (Metric *)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"depfile load",(allocator<char> *)&local_b8);
      pMVar8 = Metrics::NewMetric(this_00,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    LoadDepFile::metrics_h_metric = pMVar8;
    __cxa_guard_release(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_98,LoadDepFile::metrics_h_metric);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  iVar4 = (**(code **)(*(long *)this->disk_interface_ + 0x10))
                    (this->disk_interface_,path,&local_b8,err);
  if (iVar4 == 1) {
    err->_M_string_length = 0;
    *(err->_M_dataplus)._M_p = '\0';
LAB_00112bfa:
    if (local_b8._M_string_length != 0) {
      DepfileParser::DepfileParser(&local_110);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      bVar3 = DepfileParser::Parse(&local_110,&local_b8,&local_d8);
      pSVar9 = local_110.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (bVar3) {
        if (local_110.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_110.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::operator+(&local_150,path,": no outputs declared");
          this_02 = &local_150;
          std::__cxx11::string::operator=((string *)err,(string *)this_02);
          goto LAB_00112db5;
        }
        bVar3 = CanonicalizePath((local_110.outs_.
                                  super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->str_,
                                 &(local_110.outs_.
                                   super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->len_,&local_48,err);
        if (!bVar3) {
          std::operator+(&local_130,path,": ");
          std::operator+(&local_150,&local_130,err);
          goto LAB_00112d98;
        }
        pNVar7 = *(edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_40 = (State *)(pNVar7->path_)._M_dataplus._M_p;
        this_01 = (ImplicitDepLoader *)&local_40;
        local_38 = (DiskInterface *)(pNVar7->path_)._M_string_length;
        bVar3 = StringPiece::operator!=((StringPiece *)this_01,pSVar9);
        __stream = _stderr;
        this_03 = local_110.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (bVar3) {
          if (g_explaining == true) {
            pcVar1 = (path->_M_dataplus)._M_p;
            _Var2._M_p = (pNVar7->path_)._M_dataplus._M_p;
            StringPiece::AsString_abi_cxx11_(&local_150,pSVar9);
            bVar3 = false;
            fprintf(__stream,
                    "ninja explain: expected depfile \'%s\' to mention \'%s\', got \'%s\'\n",pcVar1,
                    _Var2._M_p,local_150._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_150);
            goto LAB_00112dbc;
          }
          goto LAB_00112dba;
        }
        for (; this_03 !=
               local_110.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl
               .super__Vector_impl_data._M_finish; this_03 = this_03 + 1) {
          this_01 = (ImplicitDepLoader *)
                    (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          _Var5 = std::
                  __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_pred<matches>>
                            (this_01,(edge->outputs_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish,this_03);
          if (_Var5._M_current ==
              (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::operator+(&local_68,path,": depfile mentions \'");
            StringPiece::AsString_abi_cxx11_(&local_88,this_03);
            std::operator+(&local_130,&local_68,&local_88);
            std::operator+(&local_150,&local_130,"\' as an output, but no such output was declared")
            ;
            std::__cxx11::string::operator=((string *)err,(string *)&local_150);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&local_88);
            this_02 = &local_68;
            goto LAB_00112db5;
          }
        }
        iVar6 = PreallocateSpace(this_01,edge,
                                 (int)((ulong)((long)local_110.ins_.
                                                                                                          
                                                  super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_110.ins_.
                                                                                                        
                                                  super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
        for (pSVar9 = local_110.ins_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pSVar9 != local_110.ins_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                      _M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
          bVar3 = CanonicalizePath(pSVar9->str_,&pSVar9->len_,(uint64_t *)&local_150,err);
          if (!bVar3) goto LAB_00112dba;
          pNVar7 = State::GetNode(this->state_,*pSVar9,(uint64_t)local_150._M_dataplus._M_p);
          *iVar6._M_current = pNVar7;
          Node::AddOutEdge(pNVar7,edge);
          CreatePhonyInEdge(this,pNVar7);
          iVar6._M_current = iVar6._M_current + 1;
        }
        bVar3 = true;
      }
      else {
        std::operator+(&local_130,path,": ");
        std::operator+(&local_150,&local_130,&local_d8);
LAB_00112d98:
        std::__cxx11::string::operator=((string *)err,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        this_02 = &local_130;
LAB_00112db5:
        std::__cxx11::string::~string((string *)this_02);
LAB_00112dba:
        bVar3 = false;
      }
LAB_00112dbc:
      std::__cxx11::string::~string((string *)&local_d8);
      DepfileParser::~DepfileParser(&local_110);
      goto LAB_00112dd3;
    }
    if (g_explaining == true) {
      bVar3 = false;
      fprintf(_stderr,"ninja explain: depfile \'%s\' is missing\n",(path->_M_dataplus)._M_p);
      goto LAB_00112dd3;
    }
  }
  else {
    if (iVar4 != 2) goto LAB_00112bfa;
    std::operator+(&local_150,"loading \'",path);
    std::operator+(&local_d8,&local_150,"\': ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110,
                   &local_d8,err);
    std::__cxx11::string::operator=((string *)err,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_150);
  }
  bVar3 = false;
LAB_00112dd3:
  std::__cxx11::string::~string((string *)&local_b8);
  ScopedMetric::~ScopedMetric(&local_98);
  return bVar3;
}

Assistant:

bool ImplicitDepLoader::LoadDepFile(Edge* edge, const string& path,
                                    string* err) {
  METRIC_RECORD("depfile load");
  // Read depfile content.  Treat a missing depfile as empty.
  string content;
  switch (disk_interface_->ReadFile(path, &content, err)) {
  case DiskInterface::Okay:
    break;
  case DiskInterface::NotFound:
    err->clear();
    break;
  case DiskInterface::OtherError:
    *err = "loading '" + path + "': " + *err;
    return false;
  }
  // On a missing depfile: return false and empty *err.
  if (content.empty()) {
    EXPLAIN("depfile '%s' is missing", path.c_str());
    return false;
  }

  DepfileParser depfile(depfile_parser_options_
                        ? *depfile_parser_options_
                        : DepfileParserOptions());
  string depfile_err;
  if (!depfile.Parse(&content, &depfile_err)) {
    *err = path + ": " + depfile_err;
    return false;
  }

  if (depfile.outs_.empty()) {
    *err = path + ": no outputs declared";
    return false;
  }

  uint64_t unused;
  std::vector<StringPiece>::iterator primary_out = depfile.outs_.begin();
  if (!CanonicalizePath(const_cast<char*>(primary_out->str_),
                        &primary_out->len_, &unused, err)) {
    *err = path + ": " + *err;
    return false;
  }

  // Check that this depfile matches the edge's output, if not return false to
  // mark the edge as dirty.
  Node* first_output = edge->outputs_[0];
  StringPiece opath = StringPiece(first_output->path());
  if (opath != *primary_out) {
    EXPLAIN("expected depfile '%s' to mention '%s', got '%s'", path.c_str(),
            first_output->path().c_str(), primary_out->AsString().c_str());
    return false;
  }

  // Ensure that all mentioned outputs are outputs of the edge.
  for (std::vector<StringPiece>::iterator o = depfile.outs_.begin();
       o != depfile.outs_.end(); ++o) {
    matches m(o);
    if (std::find_if(edge->outputs_.begin(), edge->outputs_.end(), m) == edge->outputs_.end()) {
      *err = path + ": depfile mentions '" + o->AsString() + "' as an output, but no such output was declared";
      return false;
    }
  }

  // Preallocate space in edge->inputs_ to be filled in below.
  vector<Node*>::iterator implicit_dep =
      PreallocateSpace(edge, depfile.ins_.size());

  // Add all its in-edges.
  for (vector<StringPiece>::iterator i = depfile.ins_.begin();
       i != depfile.ins_.end(); ++i, ++implicit_dep) {
    uint64_t slash_bits;
    if (!CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits,
                          err))
      return false;

    Node* node = state_->GetNode(*i, slash_bits);
    *implicit_dep = node;
    node->AddOutEdge(edge);
    CreatePhonyInEdge(node);
  }

  return true;
}